

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

VkShaderModule createShaderModule(Init *init,vector<char,_std::allocator<char>_> *code)

{
  VkResult VVar1;
  VkShaderModule pVVar2;
  VkShaderModule shaderModule;
  VkShaderModule local_40;
  VkShaderModuleCreateInfo local_38;
  
  local_38.flags = 0;
  local_38._20_4_ = 0;
  local_38.pNext = (void *)0x0;
  local_38.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_38._4_4_ = 0;
  local_38.pCode =
       (uint32_t *)
       (code->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_38.codeSize =
       (long)(code->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_finish - (long)local_38.pCode;
  VVar1 = vkb::DispatchTable::createShaderModule
                    (&init->disp,&local_38,(VkAllocationCallbacks *)0x0,&local_40);
  pVVar2 = (VkShaderModule)0x0;
  if (VVar1 == VK_SUCCESS) {
    pVVar2 = local_40;
  }
  return pVVar2;
}

Assistant:

VkShaderModule createShaderModule(Init& init, const std::vector<char>& code) {
    VkShaderModuleCreateInfo create_info = {};
    create_info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    create_info.codeSize = code.size();
    create_info.pCode = reinterpret_cast<const uint32_t*>(code.data());

    VkShaderModule shaderModule;
    if (init.disp.createShaderModule(&create_info, nullptr, &shaderModule) != VK_SUCCESS) {
        return VK_NULL_HANDLE; // failed to create shader module
    }

    return shaderModule;
}